

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

uchar * glfwGetJoystickButtons(int jid,int *count)

{
  int iVar1;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/src/input.c"
                  ,0x286,"const unsigned char *glfwGetJoystickButtons(int, int *)");
  }
  if (0xf < (uint)jid) {
    __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/src/input.c"
                  ,0x287,"const unsigned char *glfwGetJoystickButtons(int, int *)");
  }
  if (count == (int *)0x0) {
    __assert_fail("count != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/src/input.c"
                  ,0x288,"const unsigned char *glfwGetJoystickButtons(int, int *)");
  }
  *count = 0;
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((_glfw.joysticks[(uint)jid].present != 0) &&
          (iVar1 = _glfwPlatformPollJoystick(jid,2), iVar1 != 0)) {
    *count = _glfw.joysticks[(uint)jid].buttonCount;
    return _glfw.joysticks[(uint)jid].buttons;
  }
  return (uchar *)0x0;
}

Assistant:

char* glfwGetJoystickButtons(int jid, int* count)
{
    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick %i", jid);
        return NULL;
    }

    if (!_glfw.joysticks[jid].present)
        return NULL;

    if (!_glfwPlatformPollJoystick(jid, _GLFW_POLL_BUTTONS))
        return NULL;

    *count = _glfw.joysticks[jid].buttonCount;
    return _glfw.joysticks[jid].buttons;
}